

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O0

bool box_x_compare(shared_ptr<hittable> *a,shared_ptr<hittable> *b)

{
  bool bVar1;
  shared_ptr<hittable> local_38;
  shared_ptr<hittable> local_28;
  shared_ptr<hittable> *local_18;
  shared_ptr<hittable> *b_local;
  shared_ptr<hittable> *a_local;
  
  local_18 = b;
  b_local = a;
  std::shared_ptr<hittable>::shared_ptr(&local_28,a);
  std::shared_ptr<hittable>::shared_ptr(&local_38,b);
  bVar1 = box_compare(&local_28,&local_38,0);
  std::shared_ptr<hittable>::~shared_ptr(&local_38);
  std::shared_ptr<hittable>::~shared_ptr(&local_28);
  return bVar1;
}

Assistant:

bool box_x_compare (const shared_ptr<hittable> a, const shared_ptr<hittable> b) {
    return box_compare(a, b, 0);
}